

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::NewClassExpressionSyntax::setChild
          (NewClassExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  ArgumentListSyntax *pAVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  
  ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                      ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  if (index == 0) {
    if (*ppSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar3 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar3 = *ppSVar1;
    }
    (this->scopedNew).ptr = (NameSyntax *)pSVar3;
  }
  else {
    if (*ppSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pAVar2 = (ArgumentListSyntax *)0x0;
    }
    else {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pAVar2 = (ArgumentListSyntax *)*ppSVar1;
    }
    this->argList = pAVar2;
  }
  return;
}

Assistant:

void NewClassExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: scopedNew = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 1: argList = child.node() ? &child.node()->as<ArgumentListSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}